

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeBufferApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::framebuffer_renderbuffer
               (NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  GLuint local_18;
  GLuint local_14;
  GLuint rbo;
  GLuint fbo;
  NegativeTestContext *ctx_local;
  
  local_14 = 0x1234;
  local_18 = 0x1234;
  _rbo = ctx;
  glu::CallLogWrapper::glGenFramebuffers(&ctx->super_CallLogWrapper,1,&local_14);
  glu::CallLogWrapper::glBindFramebuffer(&_rbo->super_CallLogWrapper,0x8d40,local_14);
  glu::CallLogWrapper::glGenRenderbuffers(&_rbo->super_CallLogWrapper,1,&local_18);
  pNVar1 = _rbo;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_ENUM is generated if target is not one of the accepted tokens.",&local_39);
  NegativeTestContext::beginSection(pNVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glFramebufferRenderbuffer
            (&_rbo->super_CallLogWrapper,0xffffffff,0x8ce0,0x8d41,0);
  NegativeTestContext::expectError(_rbo,0x500);
  NegativeTestContext::endSection(_rbo);
  pNVar1 = _rbo;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "GL_INVALID_ENUM is generated if attachment is not one of the accepted tokens.",
             &local_71);
  NegativeTestContext::beginSection(pNVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  glu::CallLogWrapper::glFramebufferRenderbuffer
            (&_rbo->super_CallLogWrapper,0x8d40,0xffffffff,0x8d41,0);
  NegativeTestContext::expectError(_rbo,0x500);
  NegativeTestContext::endSection(_rbo);
  pNVar1 = _rbo;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,
             "GL_INVALID_ENUM is generated if renderbuffertarget is not GL_RENDERBUFFER.",&local_99)
  ;
  NegativeTestContext::beginSection(pNVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  glu::CallLogWrapper::glBindRenderbuffer(&_rbo->super_CallLogWrapper,0x8d41,local_18);
  glu::CallLogWrapper::glFramebufferRenderbuffer
            (&_rbo->super_CallLogWrapper,0x8d40,0x8ce0,0xffffffff,local_18);
  NegativeTestContext::expectError(_rbo,0x500);
  glu::CallLogWrapper::glBindRenderbuffer(&_rbo->super_CallLogWrapper,0x8d41,0);
  NegativeTestContext::endSection(_rbo);
  pNVar1 = _rbo;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,
             "GL_INVALID_OPERATION is generated if renderbuffer is neither 0 nor the name of an existing renderbuffer object."
             ,&local_c1);
  NegativeTestContext::beginSection(pNVar1,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  glu::CallLogWrapper::glFramebufferRenderbuffer
            (&_rbo->super_CallLogWrapper,0x8d40,0x8ce0,0x8d41,0xffffffff);
  NegativeTestContext::expectError(_rbo,0x502);
  NegativeTestContext::endSection(_rbo);
  pNVar1 = _rbo;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"GL_INVALID_OPERATION is generated if zero is bound to target.",
             &local_e9);
  NegativeTestContext::beginSection(pNVar1,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  glu::CallLogWrapper::glBindFramebuffer(&_rbo->super_CallLogWrapper,0x8d40,0);
  glu::CallLogWrapper::glFramebufferRenderbuffer(&_rbo->super_CallLogWrapper,0x8d40,0x8ce0,0x8d41,0)
  ;
  NegativeTestContext::expectError(_rbo,0x502);
  NegativeTestContext::endSection(_rbo);
  glu::CallLogWrapper::glDeleteRenderbuffers(&_rbo->super_CallLogWrapper,1,&local_18);
  glu::CallLogWrapper::glDeleteFramebuffers(&_rbo->super_CallLogWrapper,1,&local_14);
  return;
}

Assistant:

void framebuffer_renderbuffer (NegativeTestContext& ctx)
{
	GLuint fbo = 0x1234;
	GLuint rbo = 0x1234;
	ctx.glGenFramebuffers(1, &fbo);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, fbo);
	ctx.glGenRenderbuffers(1, &rbo);

	ctx.beginSection("GL_INVALID_ENUM is generated if target is not one of the accepted tokens.");
	ctx.glFramebufferRenderbuffer(-1, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if attachment is not one of the accepted tokens.");
	ctx.glFramebufferRenderbuffer(GL_FRAMEBUFFER, -1, GL_RENDERBUFFER, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if renderbuffertarget is not GL_RENDERBUFFER.");
	ctx.glBindRenderbuffer(GL_RENDERBUFFER, rbo);
	ctx.glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, -1, rbo);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glBindRenderbuffer(GL_RENDERBUFFER, 0);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if renderbuffer is neither 0 nor the name of an existing renderbuffer object.");
	ctx.glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, -1);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if zero is bound to target.");
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, 0);
	ctx.glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteRenderbuffers(1, &rbo);
	ctx.glDeleteFramebuffers(1, &fbo);
}